

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execNEST.cpp
# Opt level: O3

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* GetBand(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *__return_storage_ptr__,vector<double,_std::allocator<double>_> *S1s,
         vector<double,_std::allocator<double>_> *S2s,bool resol,int nFold)

{
  pointer *ppdVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  pointer pdVar6;
  pointer pvVar7;
  long lVar8;
  long lVar9;
  pointer pvVar10;
  double *pdVar11;
  long lVar12;
  long lVar13;
  pointer pdVar14;
  int iVar15;
  uint uVar16;
  double (*padVar17) [7];
  iterator iVar18;
  vector<double,std::allocator<double>> *this;
  void *__dest;
  long lVar19;
  size_type __new_size;
  ulong uVar20;
  double dVar21;
  undefined1 auVar23 [16];
  double dVar22;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined4 uVar26;
  undefined4 uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  uint64_t reject [1000];
  double local_1fd0;
  vector<double,_std::allocator<double>_> *local_1fc8;
  vector<double,_std::allocator<double>_> *local_1fc0;
  double local_1fb8;
  double local_1fb0;
  undefined1 local_1fa8 [16];
  double local_1f98;
  double local_1f90;
  double local_1f88;
  double dStack_1f80;
  value_type local_1f78 [333];
  
  __new_size = (size_type)numBins;
  local_1fc8 = S1s;
  local_1fc0 = S2s;
  if (1000 < (long)__new_size) {
    if (0 < verbosity) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "ERROR: Too many bins. Decrease numBins (analysis.hh) or increase NUMBINS_MAX (TestSpectra.hh)"
                 ,0x5d);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    }
    exit(1);
  }
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(8);
  local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 1;
  *local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
   ._M_start = -999.0;
  local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(__return_storage_ptr__,__new_size,local_1f78);
  if (local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar15 = numBins;
  pdVar11 = &maxS1;
  if (useS2 == 2) {
    pdVar11 = &maxS2;
  }
  local_1fb8 = *pdVar11;
  pdVar11 = &minS1;
  if (useS2 == 2) {
    pdVar11 = &minS2;
  }
  local_1fb0 = *pdVar11;
  memset(local_1f78,0,8000);
  if (resol) {
    numBins = 1;
    dVar21 = 1.79769313486232e+308;
    iVar15 = 1;
  }
  else {
    dVar21 = (local_1fb8 - local_1fb0) / (double)iVar15;
  }
  if (nFold == 0) {
    uVar26 = 0xffffffff;
    uVar27 = 0xffefffff;
  }
  else {
    uVar26 = 0;
    uVar27 = 0;
  }
  local_1f90 = (double)CONCAT44(uVar27,uVar26);
  pdVar6 = (local_1fc8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_1fb8 = dVar21;
  if ((local_1fc8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_finish != pdVar6) {
    local_1f88 = dVar21 * 0.5;
    local_1f98 = local_1fb0 + local_1f88;
    uVar20 = 0;
    do {
      lVar13 = (long)numBins;
      if (0 < lVar13) {
        padVar17 = band;
        lVar12 = 0;
        lVar8 = 0;
        do {
          dVar22 = (double)(int)lVar8 * dVar21 + local_1f98;
          if (uVar20 == 0 && !resol) {
            (*padVar17)[0] = dVar22;
          }
          dVar2 = pdVar6[uVar20];
          dVar21 = local_1fb8;
          if (dVar22 - local_1f88 < ABS(dVar2)) {
            if ((nFold == 0) || (ABS(dVar2) <= dVar22 + local_1f88)) goto LAB_0010c8d5;
          }
          else if (nFold == 0) {
LAB_0010c8d5:
            if (local_1f90 <= dVar2) {
              pdVar14 = (local_1fc0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              dVar22 = pdVar14[uVar20];
              if (0.0 <= dVar22) {
                if (resol) {
                  pvVar10 = (__return_storage_ptr__->
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  this = (vector<double,std::allocator<double>> *)
                         ((long)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + lVar12);
                  iVar18._M_current =
                       *(double **)
                        ((long)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>).
                                _M_impl.super__Vector_impl_data + lVar12 + 8);
                  if (iVar18._M_current ==
                      *(double **)
                       ((long)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>).
                               _M_impl.super__Vector_impl_data + lVar12 + 0x10)) {
                    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                              (this,iVar18,pdVar14 + uVar20);
                  }
                  else {
                    *iVar18._M_current = dVar22;
LAB_0010cbfb:
                    *(double **)(this + 8) = iVar18._M_current + 1;
                  }
                }
                else {
                  bVar3 = dVar22 == 0.0;
                  bVar4 = dVar2 == 0.0;
                  if (useS2 == 1) {
                    if (((bVar4 || bVar3) || (dVar21 = log10(dVar22), dVar21 <= logMin)) ||
                       (dVar21 = log10((local_1fc0->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data._M_start[uVar20]), logMax <= dVar21))
                    {
                      pvVar10 = (__return_storage_ptr__->
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
                      this = (vector<double,std::allocator<double>> *)
                             ((long)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>).
                                     _M_impl.super__Vector_impl_data + lVar12);
                      local_1fd0 = 0.0;
                      iVar18._M_current =
                           *(double **)
                            ((long)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data + lVar12 + 8);
                      if (iVar18._M_current !=
                          *(double **)
                           ((long)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data + lVar12 + 0x10))
                      goto LAB_0010cbf4;
                      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                                ((vector<double,_std::allocator<double>_> *)this,iVar18,&local_1fd0)
                      ;
                    }
                    else {
                      local_1fa8._0_8_ =
                           (__return_storage_ptr__->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                      local_1fd0 = log10((local_1fc0->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data._M_start[uVar20]);
                      iVar18._M_current = *(double **)(local_1fa8._0_8_ + 8 + lVar12);
                      if (iVar18._M_current != *(double **)(local_1fa8._0_8_ + 0x10 + lVar12))
                      goto LAB_0010cb6a;
                      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                                ((vector<double,_std::allocator<double>_> *)
                                 (local_1fa8._0_8_ + lVar12),iVar18,&local_1fd0);
                    }
                  }
                  else if (useS2 == 0) {
                    if (((bVar4 || bVar3) || (dVar21 = log10(dVar22 / dVar2), dVar21 <= logMin)) ||
                       (dVar21 = log10((local_1fc0->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data._M_start[uVar20] /
                                       (local_1fc8->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data._M_start[uVar20]), logMax <= dVar21))
                    {
                      pvVar10 = (__return_storage_ptr__->
                                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start;
                      this = (vector<double,std::allocator<double>> *)
                             ((long)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>).
                                     _M_impl.super__Vector_impl_data + lVar12);
                      local_1fd0 = 0.0;
                      iVar18._M_current =
                           *(double **)
                            ((long)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data + lVar12 + 8);
                      if (iVar18._M_current !=
                          *(double **)
                           ((long)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data + lVar12 + 0x10)) {
LAB_0010cbf4:
                        local_1fd0 = 0.0;
                        *iVar18._M_current = 0.0;
                        goto LAB_0010cbfb;
                      }
                      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                                ((vector<double,_std::allocator<double>_> *)this,iVar18,&local_1fd0)
                      ;
                    }
                    else {
                      local_1fa8._0_8_ =
                           (__return_storage_ptr__->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                      local_1fd0 = log10((local_1fc0->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data._M_start[uVar20] /
                                         (local_1fc8->
                                         super__Vector_base<double,_std::allocator<double>_>).
                                         _M_impl.super__Vector_impl_data._M_start[uVar20]);
                      iVar18._M_current = *(double **)(local_1fa8._0_8_ + 8 + lVar12);
                      if (iVar18._M_current == *(double **)(local_1fa8._0_8_ + 0x10 + lVar12)) {
                        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                                  ((vector<double,_std::allocator<double>_> *)
                                   (local_1fa8._0_8_ + lVar12),iVar18,&local_1fd0);
                      }
                      else {
LAB_0010cb6a:
                        *iVar18._M_current = local_1fd0;
                        *(double **)(local_1fa8._0_8_ + 8 + lVar12) = iVar18._M_current + 1;
                      }
                    }
                  }
                  else if (((bVar4 || bVar3) || (dVar21 = log10(dVar2 / dVar22), dVar21 <= logMin))
                          || (dVar21 = log10((local_1fc8->
                                             super__Vector_base<double,_std::allocator<double>_>).
                                             _M_impl.super__Vector_impl_data._M_start[uVar20] /
                                             (local_1fc0->
                                             super__Vector_base<double,_std::allocator<double>_>).
                                             _M_impl.super__Vector_impl_data._M_start[uVar20]),
                             logMax <= dVar21)) {
                    pvVar10 = (__return_storage_ptr__->
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start;
                    this = (vector<double,std::allocator<double>> *)
                           ((long)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data + lVar12);
                    local_1fd0 = 0.0;
                    iVar18._M_current =
                         *(double **)
                          ((long)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data + lVar12 + 8);
                    if (iVar18._M_current !=
                        *(double **)
                         ((long)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + lVar12 + 0x10))
                    goto LAB_0010cbf4;
                    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                              ((vector<double,_std::allocator<double>_> *)this,iVar18,&local_1fd0);
                  }
                  else {
                    local_1fa8._0_8_ =
                         (__return_storage_ptr__->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                    local_1fd0 = log10((local_1fc8->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data._M_start[uVar20] /
                                       (local_1fc0->
                                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                       super__Vector_impl_data._M_start[uVar20]);
                    iVar18._M_current = *(double **)(local_1fa8._0_8_ + 8 + lVar12);
                    if (iVar18._M_current != *(double **)(local_1fa8._0_8_ + 0x10 + lVar12))
                    goto LAB_0010cb6a;
                    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                              ((vector<double,_std::allocator<double>_> *)
                               (local_1fa8._0_8_ + lVar12),iVar18,&local_1fd0);
                  }
                }
                band[lVar8][2] =
                     (*(pointer *)
                       ((long)&(__return_storage_ptr__->
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start[lVar8].
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data + 8))[-1] + band[lVar8][2];
                pdVar6 = (local_1fc8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                dVar21 = local_1fb8;
                if (resol) {
                  band[lVar8][0] = pdVar6[uVar20] + band[lVar8][0];
                }
                else {
                  band[lVar8][1] = pdVar6[uVar20] + band[lVar8][1];
                }
                break;
              }
            }
            ppdVar1 = &local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar8;
            *ppdVar1 = (pointer)((long)*ppdVar1 + 1);
            break;
          }
          lVar8 = lVar8 + 1;
          lVar12 = lVar12 + 0x18;
          padVar17 = padVar17 + 1;
        } while (lVar13 * 0x18 != lVar12);
      }
      uVar20 = uVar20 + 1;
      iVar15 = numBins;
    } while (uVar20 < (ulong)((long)(local_1fc8->super__Vector_base<double,_std::allocator<double>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pdVar6 >> 3)
            );
  }
  if (0 < iVar15) {
    local_1fb0 = local_1fb0 + local_1fb8 * 0.5;
    lVar13 = 0;
    local_1f98 = (double)CONCAT71(local_1f98._1_7_,!resol);
    do {
      padVar17 = band + lVar13;
      if (band[lVar13][0] <= 0.0 && !resol) {
        (*padVar17)[0] = (double)(int)lVar13 * local_1fb8 + local_1fb0;
      }
      pvVar7 = (__return_storage_ptr__->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pvVar10 = pvVar7 + lVar13;
      __dest = (pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar14 = *(pointer *)
                 ((long)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + 8);
      pdVar6 = (pointer)((long)__dest + 8);
      if (pdVar6 != pdVar14) {
        memmove(__dest,pdVar6,(long)pdVar14 - (long)pdVar6);
        pdVar14 = *(pointer *)
                   ((long)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + 8);
        pvVar7 = (__return_storage_ptr__->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        __dest = pvVar7[lVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      *(pointer *)
       ((long)&(pvVar10->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data + 8) = pdVar14 + -1;
      lVar8 = (long)*(pointer *)
                     ((long)&pvVar7[lVar13].super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data + 8) - (long)__dest;
      lVar9 = lVar8 >> 3;
      lVar12 = lVar9;
      if (lVar8 == 0 && local_1f98._0_1_ == '\0') {
        pdVar6 = (local_1fc8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar14 = (local_1fc8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        lVar12 = (long)pdVar14 - (long)pdVar6 >> 3;
        if (pdVar14 != pdVar6) {
          dVar21 = (*padVar17)[0];
          lVar19 = 0;
          do {
            dVar21 = dVar21 + ABS(pdVar6[lVar19]);
            (*padVar17)[0] = dVar21;
            lVar19 = lVar19 + 1;
          } while (lVar12 + (ulong)(lVar12 == 0) != lVar19);
        }
      }
      auVar25._8_4_ = (int)((ulong)lVar12 >> 0x20);
      auVar25._0_8_ = lVar12;
      auVar25._12_4_ = 0x45300000;
      dVar21 = (auVar25._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0);
      if (resol) {
        (*padVar17)[0] = (*padVar17)[0] / dVar21;
      }
      auVar28._8_8_ = dVar21;
      auVar28._0_8_ = dVar21;
      auVar23 = divpd(*(undefined1 (*) [16])(band[lVar13] + 1),auVar28);
      *(undefined1 (*) [16])(band[lVar13] + 1) = auVar23;
      auVar29._8_4_ = (int)(lVar8 >> 0x23);
      auVar29._0_8_ = lVar9;
      auVar29._12_4_ = 0x45300000;
      dStack_1f80 = auVar29._8_8_ - 1.9342813113834067e+25;
      local_1f88 = dStack_1f80 + ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0);
      if (dVar21 <= local_1f88) {
        local_1f88 = dVar21;
      }
      uVar16 = (uint)local_1f88;
      if (0 < (int)uVar16) {
        uVar20 = 0;
        do {
          dVar21 = *(double *)((long)__dest + uVar20 * 8);
          if ((dVar21 != -999.0) || (NAN(dVar21))) {
            dVar21 = dVar21 - auVar23._8_8_;
            band[lVar13][3] = dVar21 * dVar21 + band[lVar13][3];
          }
          uVar20 = uVar20 + 1;
        } while (uVar16 != uVar20);
      }
      pdVar6 = (local_1fc8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar12 = (long)(local_1fc8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar6;
      if (lVar12 != 0) {
        lVar12 = lVar12 >> 3;
        lVar8 = 0;
        do {
          if (((resol) && (dVar21 = pdVar6[lVar8], local_1f90 < dVar21)) &&
             (0.0 < (local_1fc0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar8])) {
            dVar21 = dVar21 - (*padVar17)[0];
            auVar23._0_8_ = auVar23._0_8_ + dVar21 * dVar21;
            band[lVar13][1] = auVar23._0_8_;
          }
          lVar8 = lVar8 + 1;
        } while (lVar12 + (ulong)(lVar12 == 0) != lVar8);
      }
      dVar22 = local_1f88 + -1.0;
      dVar21 = band[lVar13][3] / dVar22;
      if (dVar21 < 0.0) {
        local_1fa8._8_4_ = SUB84(dStack_1f80,0);
        local_1fa8._0_8_ = dVar22;
        local_1fa8._12_4_ = (int)((ulong)dStack_1f80 >> 0x20);
        dVar21 = sqrt(dVar21);
        dVar22 = (double)local_1fa8._0_8_;
      }
      else {
        dVar21 = SQRT(dVar21);
      }
      band[lVar13][3] = dVar21;
      if (resol) {
        dVar22 = band[lVar13][1] / dVar22;
        if (dVar22 < 0.0) {
          dVar22 = sqrt(dVar22);
        }
        else {
          dVar22 = SQRT(dVar22);
        }
        band[lVar13][1] = dVar22;
        dVar21 = band[lVar13][3];
      }
      pdVar6 = (&local_1f78[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start)[lVar13];
      auVar30._0_8_ = (double)CONCAT44(0x43300000,(int)pdVar6);
      auVar30._8_4_ = (int)((ulong)pdVar6 >> 0x20);
      auVar30._12_4_ = 0x45300000;
      dVar22 = (auVar30._8_8_ - 1.9342813113834067e+25) + (auVar30._0_8_ - 4503599627370496.0) +
               local_1f88;
      auVar24._8_8_ = local_1f88;
      auVar24._0_8_ = dVar21;
      auVar5._8_4_ = SUB84(dVar22,0);
      auVar5._0_8_ = SQRT(local_1f88);
      auVar5._12_4_ = (int)((ulong)dVar22 >> 0x20);
      auVar25 = divpd(auVar24,auVar5);
      *(undefined1 (*) [16])(band[lVar13] + 4) = auVar25;
      if (0 < (int)uVar16) {
        pvVar10 = (__return_storage_ptr__->
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        uVar20 = 0;
        do {
          dVar21 = *(double *)
                    (*(long *)&pvVar10[lVar13].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data + uVar20 * 8);
          if ((dVar21 != -999.0) || (NAN(dVar21))) {
            dVar21 = pow((dVar21 - band[lVar13][2]) / band[lVar13][3],3.0);
            band[lVar13][6] = dVar21 + band[lVar13][6];
            pvVar10 = (__return_storage_ptr__->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          }
          uVar20 = uVar20 + 1;
        } while (uVar16 != uVar20);
      }
      band[lVar13][6] = band[lVar13][6] / (local_1f88 + -2.0);
      lVar13 = lVar13 + 1;
    } while (lVar13 < numBins);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<vector<double>> GetBand(vector<double> S1s, vector<double> S2s,
                               bool resol, int nFold) {
  if (numBins > NUMBINS_MAX) {
    if (verbosity > 0)
      cerr << "ERROR: Too many bins. Decrease numBins (analysis.hh) or "
              "increase NUMBINS_MAX (TestSpectra.hh)"
           << endl;
    exit(EXIT_FAILURE);
  }

  vector<vector<double>> signals;
  signals.resize(numBins, vector<double>(1, -999.));
  double binWidth, border;
  if (useS2 == 2) {
    binWidth = (maxS2 - minS2) / double(numBins);
    border = minS2;
  } else {
    binWidth = (maxS1 - minS1) / double(numBins);
    border = minS1;
  }
  int i = 0, j = 0;
  double s1c, numPts;
  uint64_t reject[NUMBINS_MAX] = {0};

  if (resol) {
    numBins = 1;
    binWidth = DBL_MAX;
  }

  double ReqS1 = 0.;
  if (nFold == 0) ReqS1 = -DBL_MAX;
  for (i = 0; i < S1s.size(); ++i) {
    for (j = 0; j < numBins; ++j) {
      s1c = border + binWidth / 2. + double(j) * binWidth;
      if (i == 0 && !resol) band[j][0] = s1c;
      if ((std::abs(S1s[i]) > (s1c - binWidth / 2.) &&
           std::abs(S1s[i]) <= (s1c + binWidth / 2.)) ||
          !nFold) {
        if (S1s[i] >= ReqS1 && S2s[i] >= 0.) {
          if (resol) {
            signals[j].push_back(S2s[i]);
          } else {
            if (useS2 == 0) {
              if (S1s[i] && S2s[i] && log10(S2s[i] / S1s[i]) > logMin &&
                  log10(S2s[i] / S1s[i]) < logMax)
                signals[j].push_back(log10(S2s[i] / S1s[i]));
              else
                signals[j].push_back(0.);
            } else if (useS2 == 1) {
              if (S1s[i] && S2s[i] && log10(S2s[i]) > logMin &&
                  log10(S2s[i]) < logMax)
                signals[j].push_back(log10(S2s[i]));
              else
                signals[j].push_back(0.);
            } else {
              if (S1s[i] && S2s[i] && log10(S1s[i] / S2s[i]) > logMin &&
                  log10(S1s[i] / S2s[i]) < logMax)
                signals[j].push_back(log10(S1s[i] / S2s[i]));
              else
                signals[j].push_back(0.);
            }
          }
          band[j][2] += signals[j].back();
          if (resol)
            band[j][0] += S1s[i];
          else
            band[j][1] += S1s[i];
        } else
          ++reject[j];
        break;
      }
    }
  }

  for (j = 0; j < numBins; ++j) {
    if (band[j][0] <= 0. && !resol)
      band[j][0] = border + binWidth / 2. + double(j) * binWidth;
    signals[j].erase(signals[j].begin());
    numPts = (double)signals[j].size();
    if (numPts <= 0 && resol) {
      for (i = 0; i < S1s.size(); ++i) band[j][0] += std::abs(S1s[i]);
      numPts = S1s.size();
    }
    if (resol) band[j][0] /= numPts;
    band[j][1] /= numPts;
    band[j][2] /= numPts;
    if (numPts > signals[j].size())
      numPts = signals[j].size();  // seg fault prevention line
    for (i = 0; i < (int)numPts; ++i) {
      if (signals[j][i] != -999.)
        band[j][3] += pow(signals[j][i] - band[j][2], 2.);  // std dev calc
    }
    for (i = 0; i < S1s.size(); ++i) {
      if (resol && S1s[i] > ReqS1 && S2s[i] > 0.0)
        band[j][1] += pow(S1s[i] - band[j][0], 2.);  // std dev calc
    }
    band[j][3] /= numPts - 1.;
    band[j][3] = sqrt(band[j][3]);
    if (resol) {
      band[j][1] /= numPts - 1.;
      band[j][1] = sqrt(band[j][1]);
    }
    band[j][4] = band[j][3] / sqrt(numPts);
    band[j][5] = numPts / (numPts + double(reject[j]));
    for (i = 0; i < (int)numPts; ++i) {
      if (signals[j][i] != -999.)
        band[j][6] +=
            pow((signals[j][i] - band[j][2]) / band[j][3], 3.);  // skew calc
    }
    band[j][6] /= (numPts - 2.);
  }

  return signals;
}